

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

int __thiscall
duckdb_fmt::v6::internal::
arg_map<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
::init(arg_map<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
       *this,EVP_PKEY_CTX *ctx)

{
  type *ptVar1;
  uint uVar2;
  undefined8 *puVar3;
  entry *peVar4;
  char *pcVar5;
  size_t sVar6;
  longlong lVar7;
  size_t sVar8;
  undefined8 uVar9;
  int in_EAX;
  entry *peVar10;
  byte bVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
  arg;
  
  if (this->map_ != (entry *)0x0) {
    return in_EAX;
  }
  uVar14 = *(ulong *)ctx;
  uVar15 = 0xc;
  if ((long)uVar14 < 0) {
    uVar15 = uVar14 & 0xffffffff;
  }
  peVar10 = (entry *)operator_new__(uVar15 * 0x30);
  if ((int)uVar15 != 0) {
    uVar13 = 0;
    do {
      *(undefined4 *)((long)&(peVar10->arg).type_ + uVar13) = 0;
      puVar3 = (undefined8 *)((long)&(peVar10->name).data_ + uVar13);
      *puVar3 = 0;
      puVar3[1] = 0;
      *(undefined4 *)((long)&(peVar10->arg).value_.field_0 + uVar13) = 0;
      uVar13 = uVar13 + 0x30;
    } while (uVar15 * 0x30 != uVar13);
  }
  this->map_ = peVar10;
  if ((long)uVar14 < 0) {
    if (0 < (int)(uint)uVar14) {
      peVar10 = (entry *)&stack0xffffffffffffffb8;
      uVar14 = (ulong)((uint)uVar14 & 0x7fffffff);
      lVar12 = 0x10;
      do {
        if (*(int *)(*(long *)(ctx + 8) + lVar12) == 1) {
          puVar3 = *(undefined8 **)(*(long *)(ctx + 8) + -0x10 + lVar12);
          pcVar5 = (char *)*puVar3;
          sVar6 = puVar3[1];
          lVar7 = puVar3[2];
          sVar8 = puVar3[3];
          uVar9 = puVar3[5];
          peVar4 = this->map_;
          uVar2 = this->size_;
          ptVar1 = &peVar4[uVar2].arg.type_;
          *(undefined8 *)ptVar1 = puVar3[4];
          *(undefined8 *)(ptVar1 + 2) = uVar9;
          peVar4[uVar2].arg.value_.field_0.long_long_value = lVar7;
          peVar4[uVar2].arg.value_.field_0.string.size = sVar8;
          peVar4[uVar2].name.data_ = pcVar5;
          peVar4[uVar2].name.size_ = sVar6;
          this->size_ = this->size_ + 1;
        }
        lVar12 = lVar12 + 0x20;
        uVar14 = uVar14 - 1;
      } while (uVar14 != 0);
    }
LAB_0126ee3a:
    return (int)peVar10;
  }
  peVar10 = (entry *)&stack0xffffffffffffffb8;
  lVar12 = 0;
  bVar11 = 0;
  do {
    uVar15 = uVar14 >> (bVar11 & 0x3f);
    if (((uint)uVar15 & 0x1f) == 1) {
      puVar3 = *(undefined8 **)(*(long *)(ctx + 8) + lVar12);
      pcVar5 = (char *)*puVar3;
      sVar6 = puVar3[1];
      lVar7 = puVar3[2];
      sVar8 = puVar3[3];
      uVar9 = puVar3[5];
      peVar4 = this->map_;
      uVar2 = this->size_;
      ptVar1 = &peVar4[uVar2].arg.type_;
      *(undefined8 *)ptVar1 = puVar3[4];
      *(undefined8 *)(ptVar1 + 2) = uVar9;
      peVar4[uVar2].arg.value_.field_0.long_long_value = lVar7;
      peVar4[uVar2].arg.value_.field_0.string.size = sVar8;
      peVar4[uVar2].name.data_ = pcVar5;
      peVar4[uVar2].name.size_ = sVar6;
      this->size_ = this->size_ + 1;
      uVar14 = *(ulong *)ctx;
    }
    else if ((uVar15 & 0x1f) == 0) goto LAB_0126ee3a;
    bVar11 = bVar11 + 5;
    lVar12 = lVar12 + 0x10;
  } while( true );
}

Assistant:

void arg_map<Context>::init(const basic_format_args<Context>& args) {
  if (map_) return;
  map_ = new entry[internal::to_unsigned(args.max_size())];
  if (args.is_packed()) {
    for (int i = 0;; ++i) {
      internal::type arg_type = args.type(i);
      if (arg_type == internal::none_type) return;
      if (arg_type == internal::named_arg_type) push_back(args.values_[i]);
    }
  }
  for (int i = 0, n = args.max_size(); i < n; ++i) {
    auto type = args.args_[i].type_;
    if (type == internal::named_arg_type) push_back(args.args_[i].value_);
  }
}